

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O2

void calculate_diameter(void)

{
  uint uVar1;
  ostream *poVar2;
  int *piVar3;
  mapped_type *pmVar4;
  int iVar5;
  int iVar6;
  size_type __n;
  double dVar7;
  long lVar8;
  key_type *pkVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int local_cc;
  int local_c8;
  allocator_type local_c1;
  double local_c0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  farthest_path;
  vector<int,_std::allocator<int>_> farthest_node;
  double local_80;
  vector<int,_std::allocator<int>_> path;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  distribution;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  max_path;
  
  freopen("diameter.txt","w",_stdout);
  __n = (size_type)V;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&max_path,0,(allocator_type *)&farthest_node);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&distribution,__n,(value_type *)&max_path,(allocator_type *)&farthest_path);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&max_path);
  max_path.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  max_path.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  max_path.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_80 = 0.0;
  local_c8 = 0;
  local_c0 = 0.0;
  uVar10 = 0;
  while( true ) {
    iVar14 = V;
    if (V <= local_c8) break;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&farthest_path,(long)V,
               (value_type_conflict *)&path.super__Vector_base<int,_std::allocator<int>_>,
               (allocator_type *)&local_cc);
    local_cc = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &path.super__Vector_base<int,_std::allocator<int>_>,(long)V,
               (value_type_conflict *)&local_cc,&local_c1);
    _DAT_0011f388 = (anonymous_namespace)::usedbfs;
    _DAT_0011f390 = 0;
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedbfs,(long)V,false)
    ;
    bfs(local_c8,(vector<int,_std::allocator<int>_> *)&farthest_path,
        (vector<int,_std::allocator<int>_> *)&path.super__Vector_base<int,_std::allocator<int>_>);
    uVar11 = 0;
    for (local_cc = 0; local_cc < V; local_cc = local_cc + 1) {
      uVar1 = *(uint *)((long)&((farthest_path.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + (long)local_cc * 4);
      if ((int)uVar11 < (int)uVar1) {
        uVar11 = uVar1;
      }
      if ((int)uVar10 < (int)uVar1) {
        if (farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::clear(&max_path);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(&max_path,(value_type *)&path.super__Vector_base<int,_std::allocator<int>_>);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&farthest_node,(value_type_conflict *)&local_cc);
        uVar10 = uVar1;
      }
      else if (uVar1 == uVar10) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(&max_path,(value_type *)&path.super__Vector_base<int,_std::allocator<int>_>);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&farthest_node,(value_type_conflict *)&local_cc);
      }
      local_c0 = local_c0 + (double)(int)uVar1;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (distribution.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar11,&local_c8);
    local_80 = local_80 + (double)(int)uVar11;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&path.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&farthest_path);
    local_c8 = local_c8 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Diameter: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar10);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Average path: ");
  poVar2 = std::ostream::_M_insert<double>(local_c0 / (double)(iVar14 * iVar14));
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Average farthest path: ");
  poVar2 = std::ostream::_M_insert<double>(local_80 / (double)iVar14);
  std::endl<char,std::char_traits<char>>(poVar2);
  farthest_path.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  farthest_path.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  farthest_path.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar12 = 0;
      uVar12 < (ulong)((long)farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2); uVar12 = uVar12 + 1) {
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&farthest_path,
               (vector<int,_std::allocator<int>_> *)
               &path.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&path.super__Vector_base<int,_std::allocator<int>_>);
    piVar3 = farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + uVar12;
    while (path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,*piVar3),
          *piVar3 != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (farthest_path.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,
                 (value_type_conflict *)&path.super__Vector_base<int,_std::allocator<int>_>);
      piVar3 = max_path.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start +
               (int)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Farthest paths:");
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar7 = 0.0;
  while (iVar14 = V,
        (ulong)dVar7 <
        (ulong)(((long)farthest_path.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)farthest_path.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    local_c0 = (double)((long)dVar7 + 1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,SUB84(local_c0,0));
    std::operator<<(poVar2,": ");
    for (pkVar9 = farthest_path.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar7].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        pkVar9 != farthest_path.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar7].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish; pkVar9 = pkVar9 + 1) {
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,pkVar9);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
      std::operator<<(poVar2,". ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    dVar7 = local_c0;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Farthest paths distribution:");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar13 = 8;
  for (lVar8 = 0; lVar8 <= (int)uVar10; lVar8 = lVar8 + 1) {
    iVar6 = (int)lVar8;
    iVar5 = iVar14;
    if (iVar6 < iVar14) {
      iVar5 = iVar6;
    }
    if (*(long *)((long)&((distribution.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar13) !=
        *(long *)((long)distribution.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8)) {
      iVar14 = iVar5;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar13 = lVar13 + 0x18;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Characters with minimum farthest path:");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (pkVar9 = distribution.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar14].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pkVar9 != distribution.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar14].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; pkVar9 = pkVar9 + 1) {
    pmVar4 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,pkVar9);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&farthest_path);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&farthest_node.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&max_path);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&distribution);
  return;
}

Assistant:

void calculate_diameter() {
    freopen("diameter.txt", "w", stdout); // output file

    int diameter = 0;
    int current_max = 0;
    double average_max = 0;
    double average_average = 0;
    vector< vector<int> > distribution(V, vector<int> (0));
    vector< vector<int> > max_path;
    vector<int> farthest_node;
    for (int i = 0; i < V; i++) {
        vector<int> distance_to(V, 0);
        vector<int> path(V,-1);
        usedbfs.clear();
        usedbfs.resize(V, false);
        bfs(i, distance_to, path);
        current_max = 0;
        for (int j = 0; j < V; j++) {
            average_average += distance_to[j];

            if (distance_to[j] > current_max)
                current_max = distance_to[j];

            if (distance_to[j] > diameter) {
                diameter = distance_to[j];
                farthest_node.clear();
                max_path.clear();
                max_path.push_back(path);
                farthest_node.push_back(j);
            } else if (distance_to[j] == diameter){
                max_path.push_back(path);
                farthest_node.push_back(j);
            }
        }
        average_max += current_max;
        distribution[current_max].push_back(i);
    }
    average_max /= V;
    average_average /= V*V;

    cout << "Diameter: " << diameter << endl;
    cout << "Average path: " << average_average << endl;
    cout << "Average farthest path: " << average_max << endl;

    vector < vector<int> > farthest_path;

    for (int i = 0; i < farthest_node.size(); i++) {
        farthest_path.push_back(vector<int>());
        for (int u = farthest_node[i]; u != -1; u = max_path[i][u])
            farthest_path[i].push_back(u);
    }

    cout << "Farthest paths:" << endl;
    for (int i = 0; i < farthest_path.size(); i++) {
        cout << i+1 << ": ";
        for (vector<int>::iterator j = farthest_path[i].begin(); j != farthest_path[i].end(); j++)
            cout << name[*j] << ". ";
        cout << endl;
    }

    int minimum = V;
    cout << "Farthest paths distribution:" << endl;
    for (int i = 0; i <= diameter; i++) {
        if (distribution[i].size() != 0 && i < minimum)
            minimum = i;

        cout << i << ": " << distribution[i].size() << endl;
    }

    cout << "Characters with minimum farthest path:" << endl;
    for (vector<int>::iterator i = distribution[minimum].begin(); i != distribution[minimum].end(); i++) {
        cout << name[*i] << endl;
    }
}